

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O3

void adapt_prob(RK_U8 *p,RK_U32 ct0,RK_U32 ct1,RK_S32 max_count,RK_S32 update_factor)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = ct1 + ct0;
  if (uVar4 != 0) {
    uVar1 = ((uVar4 >> 1) + ct0 * 0x100) / uVar4;
    uVar3 = 0xff;
    if (uVar1 < 0xff) {
      uVar3 = uVar1;
    }
    uVar2 = 1;
    if (0 < (int)uVar1) {
      uVar2 = uVar3;
    }
    uVar5 = (ulong)uVar4;
    if ((uint)max_count <= uVar4) {
      uVar5 = (ulong)(uint)max_count;
    }
    *p = (char)((uVar2 - *p) *
                (int)((ulong)vpx_inverse[(uint)max_count] * uVar5 * (uint)update_factor >> 0x20) +
                0x80 >> 8) + *p;
  }
  return;
}

Assistant:

static void adapt_prob(RK_U8 *p, RK_U32 ct0, RK_U32 ct1,
                       RK_S32 max_count, RK_S32 update_factor)
{
    RK_U32 ct = ct0 + ct1, p2, p1;

    if (!ct)
        return;

    p1 = *p;
    p2 = ((ct0 << 8) + (ct >> 1)) / ct;
    p2 = mpp_clip(p2, 1, 255);
    ct = MPP_MIN(ct, (RK_U32)max_count);
    update_factor = FASTDIV(update_factor * ct, max_count);

    // (p1 * (256 - update_factor) + p2 * update_factor + 128) >> 8
    *p = p1 + (((p2 - p1) * update_factor + 128) >> 8);
}